

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
          (FlatBufferBuilderImpl<false> *this,FlatBufferBuilderImpl<false> *other)

{
  (this->buf_).allocator_ = (Allocator *)0x0;
  (this->buf_).own_allocator_ = false;
  (this->buf_).initial_size_ = 0x400;
  (this->buf_).max_size_ = 0x7fffffff;
  (this->buf_).buffer_minalign_ = 8;
  (this->buf_).reserved_ = 0;
  (this->buf_).size_ = 0;
  this->length_of_64_bit_region_ = 0;
  this->nested = false;
  this->finished = false;
  (this->buf_).buf_ = (uint8_t *)0x0;
  (this->buf_).cur_ = (uint8_t *)0x0;
  *(undefined8 *)((long)&(this->buf_).cur_ + 6) = 0;
  *(undefined8 *)((long)&(this->buf_).scratch_ + 6) = 0;
  this->minalign_ = 1;
  this->force_defaults_ = false;
  this->dedup_vtables_ = true;
  this->string_pool = (StringOffsetMap *)0x0;
  Swap(this,other);
  return;
}

Assistant:

FlatBufferBuilderImpl(FlatBufferBuilderImpl &&other) noexcept
      : buf_(1024, nullptr, false, AlignOf<largest_scalar_t>(),
             static_cast<SizeT>(Is64Aware ? FLATBUFFERS_MAX_64_BUFFER_SIZE
                                          : FLATBUFFERS_MAX_BUFFER_SIZE)),
        num_field_loc(0),
        max_voffset_(0),
        length_of_64_bit_region_(0),
        nested(false),
        finished(false),
        minalign_(1),
        force_defaults_(false),
        dedup_vtables_(true),
        string_pool(nullptr) {
    EndianCheck();
    // Default construct and swap idiom.
    // Lack of delegating constructors in vs2010 makes it more verbose than
    // needed.
    Swap(other);
  }